

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall
t_py_generator::generate_python_docstring
          (t_py_generator *this,ostream *out,t_doc *tdoc,t_struct *tstruct,char *subheader)

{
  t_field *ptVar1;
  ostream *poVar2;
  pointer pptVar3;
  string *psVar4;
  stringstream ss;
  allocator local_24b;
  allocator local_24a;
  allocator local_249;
  t_py_generator *local_248;
  ostream *local_240;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  local_248 = this;
  local_240 = out;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (tdoc->has_doc_ == true) {
    std::operator<<(&local_1a8,(string *)&tdoc->doc_);
    if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::operator<<(&local_1a8,(string *)&::endl_abi_cxx11_);
      goto LAB_0028fb0d;
    }
  }
  else {
    if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_0028fc40;
LAB_0028fb0d:
    poVar2 = std::operator<<(&local_1a8,subheader);
    std::operator<<(poVar2,":\n");
    for (pptVar3 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar3 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
      ptVar1 = *pptVar3;
      poVar2 = std::operator<<(&local_1a8," - ");
      std::operator<<(poVar2,(string *)&ptVar1->name_);
      psVar4 = &::endl_abi_cxx11_;
      poVar2 = &local_1a8;
      if ((ptVar1->super_t_doc).has_doc_ == true) {
        poVar2 = std::operator<<(&local_1a8,": ");
        psVar4 = &(ptVar1->super_t_doc).doc_;
      }
      std::operator<<(poVar2,(string *)psVar4);
    }
  }
  std::__cxx11::string::string((string *)&local_1d8,"\"\"\"\n",&local_249);
  std::__cxx11::string::string((string *)&local_1f8,"",&local_24a);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_238,"\"\"\"\n",&local_24b);
  t_generator::generate_docstring_comment
            (&local_248->super_t_generator,local_240,&local_1d8,&local_1f8,&local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
LAB_0028fc40:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void t_py_generator::generate_python_docstring(ostream& out,
                                               t_doc* tdoc,
                                               t_struct* tstruct,
                                               const char* subheader) {
  bool has_doc = false;
  stringstream ss;
  if (tdoc->has_doc()) {
    has_doc = true;
    ss << tdoc->get_doc();
  }

  const vector<t_field*>& fields = tstruct->get_members();
  if (fields.size() > 0) {
    if (has_doc) {
      ss << endl;
    }
    has_doc = true;
    ss << subheader << ":\n";
    vector<t_field*>::const_iterator p_iter;
    for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter) {
      t_field* p = *p_iter;
      ss << " - " << p->get_name();
      if (p->has_doc()) {
        ss << ": " << p->get_doc();
      } else {
        ss << endl;
      }
    }
  }

  if (has_doc) {
    generate_docstring_comment(out, "\"\"\"\n", "", ss.str(), "\"\"\"\n");
  }
}